

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FxchSCHashTable.c
# Opt level: O0

int Fxch_SCHashTableRemove
              (Fxch_SCHashTable_t *pSCHashTable,Vec_Wec_t *vCubes,uint32_t SubCubeID,uint32_t iCube,
              uint32_t iLit0,uint32_t iLit1,char fUpdate)

{
  int iVar1;
  int iVar2;
  uint32_t uVar3;
  uint32_t uVar4;
  Fxch_SCHashTable_Entry_t *pFVar5;
  Fxch_SubCube_t *pSCData0;
  Fxch_SubCube_t *pSCData1;
  int *piVar6;
  int *piVar7;
  Vec_Int_t *p;
  int local_94;
  int Result;
  int *pOutputID1;
  int *pOutputID0;
  Vec_Int_t *vDivCubePairs;
  Fxch_SubCube_t *pNextEntry;
  int iCube1;
  int iCube0;
  int z;
  int i;
  int iDiv;
  int Base;
  int idx;
  Fxch_SubCube_t *pEntry;
  Fxch_SCHashTable_Entry_t *pBin;
  int local_38;
  uint32_t BinID;
  int Pairs;
  int iEntry;
  uint32_t iLit1_local;
  uint32_t iLit0_local;
  uint32_t iCube_local;
  uint32_t SubCubeID_local;
  Vec_Wec_t *vCubes_local;
  Fxch_SCHashTable_t *pSCHashTable_local;
  
  local_38 = 0;
  Pairs = iLit1;
  iEntry = iLit0;
  iLit1_local = iCube;
  iLit0_local = SubCubeID;
  _iCube_local = vCubes;
  vCubes_local = (Vec_Wec_t *)pSCHashTable;
  MurmurHash3_x86_32(&iLit0_local,4,0x9747b28c,(void *)((long)&pBin + 4));
  pFVar5 = Fxch_SCHashTableBin((Fxch_SCHashTable_t *)vCubes_local,pBin._4_4_);
  if ((*(uint *)&pFVar5->field_0x8 & 0xffff) == 1) {
    *(uint *)&pFVar5->field_0x8 = *(uint *)&pFVar5->field_0x8 & 0xffff0000;
    pSCHashTable_local._4_4_ = 0;
  }
  else {
    BinID = 0;
    while (((int)BinID < (int)(*(uint *)&pFVar5->field_0x8 & 0xffff) &&
           (pFVar5->vSCData[(int)BinID].iCube != iLit1_local))) {
      BinID = BinID + 1;
    }
    if ((BinID == (*(uint *)&pFVar5->field_0x8 & 0xffff)) ||
       ((*(uint *)&pFVar5->field_0x8 & 0xffff) == 0)) {
      __assert_fail("( iEntry != (int)pBin->Size ) && ( pBin->Size != 0 )",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/fxch/FxchSCHashTable.c"
                    ,300,
                    "int Fxch_SCHashTableRemove(Fxch_SCHashTable_t *, Vec_Wec_t *, uint32_t, uint32_t, uint32_t, uint32_t, char)"
                   );
    }
    pSCData0 = pFVar5->vSCData + (int)BinID;
    for (iDiv = 0; iDiv < (int)(*(uint *)&pFVar5->field_0x8 & 0xffff); iDiv = iDiv + 1) {
      if (iDiv != BinID) {
        z = -1;
        pSCData1 = pFVar5->vSCData + iDiv;
        piVar6 = Vec_IntEntryP(*(Vec_Int_t **)(*(long *)vCubes_local + 0x60),
                               pSCData0->iCube * *(int *)(*(long *)vCubes_local + 0x70));
        piVar7 = Vec_IntEntryP(*(Vec_Int_t **)(*(long *)vCubes_local + 0x60),
                               pSCData1->iCube * *(int *)(*(long *)vCubes_local + 0x70));
        local_94 = 0;
        if ((((*(uint *)&pSCData0->field_0x8 >> 0x10 == 0) ||
             (*(uint *)&pSCData1->field_0x8 >> 0x10 != 0)) &&
            ((*(uint *)&pSCData0->field_0x8 >> 0x10 != 0 ||
             (*(uint *)&pSCData1->field_0x8 >> 0x10 == 0)))) &&
           ((((iVar1 = Fxch_SCHashTableEntryCompare
                                 ((Fxch_SCHashTable_t *)vCubes_local,_iCube_local,pSCData0,pSCData1)
              , iVar1 != 0 && ((*(uint *)&pSCData0->field_0x8 & 0xffff) != 0)) &&
             ((*(uint *)&pSCData1->field_0x8 & 0xffff) != 0)) &&
            (iVar1 = Fxch_DivCreate(*(Fxch_Man_t **)vCubes_local,pSCData1,pSCData0), -1 < iVar1))))
        {
          for (iCube0 = 0; iCube0 < *(int *)(*(long *)vCubes_local + 0x70); iCube0 = iCube0 + 1) {
            iVar2 = Fxch_CountOnes(piVar6[iCube0] & piVar7[iCube0]);
            local_94 = iVar2 + local_94;
          }
          for (iCube1 = 0; iCube1 < local_94; iCube1 = iCube1 + 1) {
            z = Fxch_DivRemove(*(Fxch_Man_t **)vCubes_local,(int)fUpdate,0,iVar1);
          }
          p = Vec_WecEntry(*(Vec_Wec_t **)(*(long *)vCubes_local + 0x48),z);
          for (iCube0 = 0; iVar1 = Vec_IntSize(p), iCube0 + 1 < iVar1; iCube0 = iCube0 + 2) {
            uVar3 = Vec_IntEntry(p,iCube0);
            uVar4 = Vec_IntEntry(p,iCube0 + 1);
            if (((uVar3 == pSCData1->iCube) && (uVar4 == pSCData0->iCube)) ||
               ((uVar3 == pSCData0->iCube && (uVar4 == pSCData1->iCube)))) {
              Vec_IntDrop(p,iCube0 + 1);
              Vec_IntDrop(p,iCube0);
            }
          }
          iVar1 = Vec_IntSize(p);
          if (iVar1 == 0) {
            Vec_IntErase(p);
          }
          local_38 = local_38 + 1;
        }
      }
    }
    memmove(pFVar5->vSCData + (int)BinID,pFVar5->vSCData + (long)(int)BinID + 1,
            (long)(int)(((*(uint *)&pFVar5->field_0x8 & 0xffff) - BinID) + -1) * 0xc);
    *(uint *)&pFVar5->field_0x8 =
         *(uint *)&pFVar5->field_0x8 & 0xffff0000 |
         (*(uint *)&pFVar5->field_0x8 & 0xffff) - 1 & 0xffff;
    pSCHashTable_local._4_4_ = local_38;
  }
  return pSCHashTable_local._4_4_;
}

Assistant:

int Fxch_SCHashTableRemove( Fxch_SCHashTable_t* pSCHashTable,
                            Vec_Wec_t* vCubes,
                            uint32_t SubCubeID,
                            uint32_t iCube,
                            uint32_t iLit0,
                            uint32_t iLit1,
                            char fUpdate )
{
    int iEntry;
    int Pairs = 0;
    uint32_t BinID;
    Fxch_SCHashTable_Entry_t* pBin;
    Fxch_SubCube_t* pEntry;
    int idx;

    MurmurHash3_x86_32( ( void* ) &SubCubeID, sizeof( int ), 0x9747b28c, &BinID);

    pBin = Fxch_SCHashTableBin( pSCHashTable, BinID );

    if ( pBin->Size == 1 )
    {
        pBin->Size = 0;
        return 0;
    }

    for ( iEntry = 0; iEntry < (int)pBin->Size; iEntry++ )
        if ( pBin->vSCData[iEntry].iCube == iCube )
            break;

    assert( ( iEntry != (int)pBin->Size ) && ( pBin->Size != 0 ) );

    pEntry = &( pBin->vSCData[iEntry] );
    for ( idx = 0; idx < (int)pBin->Size; idx++ )
    if ( idx != iEntry )
    {
        int Base,
            iDiv = -1;

        int i, z,
            iCube0,
            iCube1;

        Fxch_SubCube_t* pNextEntry = &( pBin->vSCData[idx] );
        Vec_Int_t* vDivCubePairs;
        int* pOutputID0 = Vec_IntEntryP( pSCHashTable->pFxchMan->vOutputID, pEntry->iCube * pSCHashTable->pFxchMan->nSizeOutputID );
        int* pOutputID1 = Vec_IntEntryP( pSCHashTable->pFxchMan->vOutputID, pNextEntry->iCube * pSCHashTable->pFxchMan->nSizeOutputID );
        int Result = 0;

        if ( (pEntry->iLit1 != 0 && pNextEntry->iLit1 == 0) || (pEntry->iLit1 == 0 && pNextEntry->iLit1 != 0)  )
            continue;

        if ( !Fxch_SCHashTableEntryCompare( pSCHashTable, vCubes, pEntry, pNextEntry )
             || pEntry->iLit0 == 0
             || pNextEntry->iLit0 == 0 )
            continue;

        Base = Fxch_DivCreate( pSCHashTable->pFxchMan, pNextEntry, pEntry );

        if ( Base < 0 )
            continue;

        for ( i = 0; i < pSCHashTable->pFxchMan->nSizeOutputID; i++ )
            Result += Fxch_CountOnes( pOutputID0[i] & pOutputID1[i] );

        for ( z = 0; z < Result; z++ )
            iDiv = Fxch_DivRemove( pSCHashTable->pFxchMan, fUpdate, 0, Base );

        vDivCubePairs = Vec_WecEntry( pSCHashTable->pFxchMan->vDivCubePairs, iDiv );
        Vec_IntForEachEntryDouble( vDivCubePairs, iCube0, iCube1, i )
            if ( ( iCube0 == (int)pNextEntry->iCube && iCube1 == (int)pEntry->iCube )  ||
                 ( iCube0 == (int)pEntry->iCube && iCube1 == (int)pNextEntry->iCube ) )
            {
                Vec_IntDrop( vDivCubePairs, i+1 );
                Vec_IntDrop( vDivCubePairs, i );
            }
        if ( Vec_IntSize( vDivCubePairs ) == 0 )
            Vec_IntErase( vDivCubePairs );

        Pairs++;
    }

    memmove(pBin->vSCData + iEntry, pBin->vSCData + iEntry + 1, (pBin->Size - iEntry - 1) * sizeof(*pBin->vSCData));
    pBin->Size -= 1;

    return Pairs;
}